

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

TableInstanceInfo * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getTableInstanceInfo
          (TableInstanceInfo *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          Name name)

{
  bool bVar1;
  Importable *this_00;
  __shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  Export *this_02;
  ModuleRunnerBase<wasm::ModuleRunner> *this_03;
  Name *pNVar3;
  ModuleRunner *pMVar4;
  Name NVar5;
  Name NVar6;
  Export *tableExport;
  mapped_type *importedInstance;
  Table *table;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Name name_local;
  
  NVar5.super_IString.str._M_str = name.super_IString.str._M_len;
  NVar5.super_IString.str._M_len = (size_t)this->wasm;
  this_00 = (Importable *)::wasm::Module::getTable(NVar5);
  bVar1 = Importable::imported(this_00);
  if (bVar1) {
    this_01 = (__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
              ::at(&this->linkedInstances,&this_00->module);
    peVar2 = std::__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    NVar6.super_IString.str._M_str = (char *)(this_00->base).super_IString.str._M_len;
    NVar6.super_IString.str._M_len =
         (size_t)(peVar2->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
    this_02 = (Export *)::wasm::Module::getExport(NVar6);
    this_03 = &std::
               __shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01)->super_ModuleRunnerBase<wasm::ModuleRunner>;
    pNVar3 = Export::getInternalName(this_02);
    getTableInstanceInfo(__return_storage_ptr__,this_03,(Name)(pNVar3->super_IString).str);
  }
  else {
    pMVar4 = self(this);
    __return_storage_ptr__->instance = pMVar4;
    (__return_storage_ptr__->name).super_IString.str._M_len = (size_t)name.super_IString.str._M_len;
    (__return_storage_ptr__->name).super_IString.str._M_str = name.super_IString.str._M_str;
  }
  return __return_storage_ptr__;
}

Assistant:

TableInstanceInfo getTableInstanceInfo(Name name) {
    auto* table = wasm.getTable(name);
    if (table->imported()) {
      auto& importedInstance = linkedInstances.at(table->module);
      auto* tableExport = importedInstance->wasm.getExport(table->base);
      return importedInstance->getTableInstanceInfo(
        *tableExport->getInternalName());
    }

    return TableInstanceInfo{self(), name};
  }